

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_linpart.cpp
# Opt level: O2

Dist * Omega_h::copies_to_linear_owners
                 (Dist *__return_storage_ptr__,CommPtr *comm,Read<long> *globals)

{
  LO nrroots;
  GO total;
  ScopedTimer omega_h_scoped_function_timer;
  allocator local_131;
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> local_130;
  Write<int> local_120;
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> local_110;
  Write<int> local_100;
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> local_f0;
  Remotes copies2lins_map;
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> local_c0;
  Remotes local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string
            ((string *)&local_70,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_linpart.cpp"
             ,&local_131);
  std::operator+(&local_50,&local_70,":");
  std::__cxx11::to_string(&local_90,0x36);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &copies2lins_map,&local_50,&local_90);
  begin_code("copies_to_linear_owners",(char *)copies2lins_map.ranks.write_.shared_alloc_.alloc);
  std::__cxx11::string::~string((string *)&copies2lins_map);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_f0,&comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>);
  Write<long>::Write(&local_100,(Write<int> *)globals);
  total = find_total_globals((CommPtr *)&local_f0,(Read<long> *)&local_100);
  Write<long>::~Write((Write<long> *)&local_100);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0._M_refcount);
  std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_c0,&comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>);
  nrroots = linear_partition_size((CommPtr *)&local_c0,total);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0._M_refcount);
  std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_110,&comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>);
  Write<long>::Write(&local_120,(Write<int> *)globals);
  globals_to_linear_owners(&copies2lins_map,(CommPtr *)&local_110,(Read<long> *)&local_120,total);
  Write<long>::~Write((Write<long> *)&local_120);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_110._M_refcount);
  std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_130,&comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>);
  Remotes::Remotes(&local_b0,&copies2lins_map);
  Dist::Dist(__return_storage_ptr__,(CommPtr *)&local_130,&local_b0,nrroots);
  Remotes::~Remotes(&local_b0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_130._M_refcount);
  Remotes::~Remotes(&copies2lins_map);
  ScopedTimer::~ScopedTimer(&omega_h_scoped_function_timer);
  return __return_storage_ptr__;
}

Assistant:

Dist copies_to_linear_owners(CommPtr comm, Read<GO> globals) {
  OMEGA_H_TIME_FUNCTION;
  auto const total = find_total_globals(comm, globals);
  auto const nlins = linear_partition_size(comm, total);
  auto const copies2lins_map = globals_to_linear_owners(comm, globals, total);
  auto const copies2lins_dist = Dist(comm, copies2lins_map, nlins);
  return copies2lins_dist;
}